

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TerminalPrinter.cpp
# Opt level: O0

void pobr::utils::TerminalPrinter::printLabel(string *message,string *color)

{
  ostream *poVar1;
  string local_1f0;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream temp;
  ostream local_190 [376];
  string *local_18;
  string *color_local;
  string *message_local;
  
  local_18 = color;
  color_local = message;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"[");
  poVar1 = std::operator<<(poVar1,(string *)color_local);
  std::operator<<(poVar1,"]");
  std::__cxx11::stringstream::str();
  colorize(&local_1d0,&local_1f0,local_18);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_1d0);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void
TerminalPrinter::printLabel(const std::string& message, const std::string& color)
{
    std::stringstream temp;

    temp << "[" << message << "]";

    std::cout << TerminalPrinter::colorize(temp.str(), color)
              << " ";
}